

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  void *pvVar1;
  yoml_t *node;
  undefined8 uVar2;
  size_t sVar3;
  size_t __n;
  h2o_vector_t *vector;
  SSL_CTX **contexts;
  int aiVar4 [2];
  FILE *pFVar5;
  undefined4 uVar6;
  run_mode_t rVar7;
  __uid_t _Var8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  pid_t pVar13;
  passwd *ppVar14;
  h2o_configurator_t *phVar15;
  yoml_t *node_00;
  time_t tVar16;
  FILE *__stream;
  int *piVar17;
  char *pcVar18;
  anon_struct_968_4_e2476a95 *paVar19;
  ulong uVar20;
  size_t i;
  size_t sVar21;
  _func_void_int *cb;
  char **__s;
  char **ppcVar22;
  undefined8 *puVar23;
  char *pcVar24;
  long lVar25;
  undefined8 uVar26;
  size_t i_1;
  resolve_tag_node_cache_entry_t *prVar27;
  size_t sVar28;
  size_t sVar29;
  h2o_iovec_t name;
  undefined8 uStack_90;
  char *pcStack_88;
  resolve_tag_arg_t resolve_tag_arg;
  undefined1 auStack_68 [8];
  yoml_parse_args_t parse_args;
  uint local_40;
  int local_3c;
  int pipefds [2];
  
  __s = &pcStack_88;
  resolve_tag_arg.node_cache.capacity = (size_t)*argv;
  uStack_90 = 0x18437b;
  conf.num_threads = h2o_numproc();
  conf.tfo_queues = 0x1000;
  uStack_90 = 0x18439a;
  conf.launch_time = time((time_t *)0x0);
  h2o_hostinfo_max_threads = 0x20;
  uStack_90 = 0x1843be;
  h2o_sem_init(&ocsp_updater_semaphore,10);
  uStack_90 = 0x1843c3;
  init_openssl();
  uStack_90 = 0x1843cb;
  h2o_config_init(&conf.globalconf);
  uStack_90 = 0x1843d0;
  _Var8 = getuid();
  if (_Var8 == 0) {
    uStack_90 = 0x1843e3;
    ppVar14 = getpwnam("nobody");
    if (ppVar14 != (passwd *)0x0) {
      conf.globalconf.user = "nobody";
    }
  }
  uStack_90 = 0x184404;
  phVar15 = h2o_configurator_create(&conf.globalconf,0x40);
  phVar15->enter = on_config_listen_enter;
  phVar15->exit = on_config_listen_exit;
  uStack_90 = 0x184433;
  h2o_configurator_define_command(phVar15,"listen",3,on_config_listen);
  uStack_90 = 0x18443e;
  phVar15 = h2o_configurator_create(&conf.globalconf,0x40);
  uStack_90 = 0x18445c;
  h2o_configurator_define_command(phVar15,"user",0x101,on_config_user);
  uStack_90 = 0x184477;
  h2o_configurator_define_command(phVar15,"pid-file",0x101,on_config_pid_file);
  uStack_90 = 0x184492;
  h2o_configurator_define_command(phVar15,"error-log",0x101,on_config_error_log);
  uStack_90 = 0x1844af;
  h2o_configurator_define_command(phVar15,"max-connections",1,on_config_max_connections);
  uStack_90 = 0x1844c8;
  h2o_configurator_define_command(phVar15,"num-threads",1,on_config_num_threads);
  uStack_90 = 0x1844e1;
  h2o_configurator_define_command
            (phVar15,"num-name-resolution-threads",1,on_config_num_name_resolution_threads);
  uStack_90 = 0x1844fa;
  h2o_configurator_define_command(phVar15,"tcp-fastopen",1,on_config_tcp_fastopen);
  uStack_90 = 0x184515;
  h2o_configurator_define_command
            (phVar15,"ssl-session-resumption",0x401,ssl_session_resumption_on_config);
  uStack_90 = 0x184530;
  h2o_configurator_define_command(phVar15,"num-ocsp-updaters",0x101,on_config_num_ocsp_updaters);
  uStack_90 = 0x18454b;
  h2o_configurator_define_command(phVar15,"temp-buffer-path",0x101,on_config_temp_buffer_path);
  uStack_90 = 0x184566;
  h2o_configurator_define_command(phVar15,"crash-handler",0x101,on_config_crash_handler);
  uStack_90 = 0x184581;
  h2o_configurator_define_command
            (phVar15,"crash-handler.wait-pipe-close",0x101,on_config_crash_handler_wait_pipe_close);
  uStack_90 = 0x184589;
  h2o_access_log_register_configurator(&conf.globalconf);
  uStack_90 = 0x184591;
  h2o_compress_register_configurator(&conf.globalconf);
  uStack_90 = 0x184599;
  h2o_expires_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845a1;
  h2o_errordoc_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845a9;
  h2o_fastcgi_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845b1;
  h2o_file_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845b9;
  h2o_throttle_resp_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845c1;
  h2o_headers_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845c9;
  h2o_proxy_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845d1;
  h2o_reproxy_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845d9;
  h2o_redirect_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845e1;
  h2o_status_register_configurator(&conf.globalconf);
  uStack_90 = 0x1845e9;
  h2o_http2_debug_state_register_configurator(&conf.globalconf);
  uStack_90 = 0x184602;
  name.len = 4;
  name.base = "main";
  h2o_config_register_simple_status_handler(&conf.globalconf,name,on_extra_status);
  pipefds = (int  [2])anon_var_dwarf_11ef35;
LAB_0018461b:
  do {
    while( true ) {
      uStack_90 = 0x18462f;
      iVar9 = getopt_long(argc,argv,"c:m:tvh",main::longopts,0);
      aiVar4 = _optarg;
      if (iVar9 == 0x6d) break;
      if (iVar9 == 0x74) {
LAB_0018463d:
        conf.run_mode = RUN_MODE_TEST;
      }
      else {
        if (iVar9 == -1) {
          uStack_90 = 0x184730;
          conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds);
          ppcVar22 = &pcStack_88;
          if (conf.server_starter.num_fds != 0xffffffffffffffff) {
            if (conf.server_starter.fds != (int *)0x0) {
              for (sVar21 = 0; sVar21 != conf.server_starter.num_fds; sVar21 = sVar21 + 1) {
                uStack_90 = 0x184761;
                set_cloexec(conf.server_starter.fds[sVar21]);
              }
              lVar25 = -(conf.server_starter.num_fds + 0xf & 0xfffffffffffffff0);
              __s = (char **)((long)&pcStack_88 + lVar25);
              *(undefined8 *)((long)&uStack_90 + lVar25) = 0x18478f;
              conf.server_starter.bound_fd_map = (char *)__s;
              memset(__s,0,conf.server_starter.num_fds);
              *(undefined8 *)((long)&uStack_90 + lVar25) = 0x18479b;
              conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
            }
            *(char *)((long)__s + -8) = -0x52;
            *(char *)((long)__s + -7) = 'G';
            *(char *)((long)__s + -6) = '\x18';
            *(char *)((long)__s + -5) = '\0';
            *(char *)((long)__s + -4) = '\0';
            *(char *)((long)__s + -3) = '\0';
            *(char *)((long)__s + -2) = '\0';
            *(char *)((long)__s + -1) = '\0';
            unsetenv("SERVER_STARTER_PORT");
            parse_args.resolve_tag.cb = (_func_yoml_t_ptr_char_ptr_yoml_t_ptr_void_ptr *)&pcStack_88
            ;
            resolve_tag_arg.node_cache.size = 0;
            auStack_68._0_4_ = pipefds[0];
            auStack_68._4_4_ = pipefds[1];
            parse_args.filename._0_4_ = 0;
            parse_args.filename._4_4_ = 0;
            pcStack_88 = (char *)0x0;
            resolve_tag_arg.node_cache.entries = (resolve_tag_node_cache_entry_t *)0x0;
            parse_args.mem_set._0_4_ = 0x184ece;
            parse_args.mem_set._4_4_ = 0;
            *(char *)((long)__s + -8) = -0x1d;
            *(char *)((long)__s + -7) = 'G';
            *(char *)((long)__s + -6) = '\x18';
            *(char *)((long)__s + -5) = '\0';
            *(char *)((long)__s + -4) = '\0';
            *(char *)((long)__s + -3) = '\0';
            *(char *)((long)__s + -2) = '\0';
            *(char *)((long)__s + -1) = '\0';
            node_00 = load_config((yoml_parse_args_t *)auStack_68,(yoml_t *)0x0);
            ppcVar22 = __s;
            if (node_00 != (yoml_t *)0x0) {
              builtin_strncpy((char *)((long)__s + -8),"\nH\x18",4);
              *(char *)((long)__s + -4) = '\0';
              *(char *)((long)__s + -3) = '\0';
              *(char *)((long)__s + -2) = '\0';
              *(char *)((long)__s + -1) = '\0';
              iVar9 = h2o_configurator_apply
                                (&conf.globalconf,node_00,(uint)(conf.run_mode != RUN_MODE_WORKER));
              if (iVar9 == 0) {
                *(char *)((long)__s + -8) = 'N';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar9 = (int)*(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = '\x10';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                lVar25 = *(long *)((long)__s + -8);
                for (prVar27 = (resolve_tag_node_cache_entry_t *)0x0; pcVar18 = pcStack_88,
                    prVar27 != resolve_tag_arg.node_cache.entries;
                    prVar27 = (resolve_tag_node_cache_entry_t *)
                              ((long)&(prVar27->filename).base + 1)) {
                  pvVar1 = *(void **)(pcStack_88 + lVar25 + -0x10);
                  builtin_strncpy((char *)((long)__s + -8),"1H\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  free(pvVar1);
                  node = *(yoml_t **)(pcVar18 + lVar25);
                  builtin_strncpy((char *)((long)__s + -8),"<H\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  yoml_free(node,(_func_void_ptr_void_ptr_int_size_t *)0x0);
                  lVar25 = lVar25 + 0x18;
                }
                builtin_strncpy((char *)((long)__s + -8),"MH\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                free(pcVar18);
                builtin_strncpy((char *)((long)__s + -8),"WH\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                yoml_free(node_00,(_func_void_ptr_void_ptr_int_size_t *)0x0);
                conf.globalconf.filecache.capacity =
                     conf.globalconf.http2.max_concurrent_requests_per_connection * 2;
                if (conf.server_starter.fds != (int *)0x0) {
                  *(char *)((long)__s + -8) = '\x01';
                  *(char *)((long)__s + -7) = '\0';
                  *(char *)((long)__s + -6) = '\0';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  uVar26 = *(undefined8 *)((long)__s + -8);
                  sVar21 = conf.server_starter.num_fds;
                  for (sVar28 = 0; sVar28 != sVar21; sVar28 = sVar28 + 1) {
                    if (conf.server_starter.bound_fd_map[sVar28] == '\0') {
                      uVar10 = conf.server_starter.fds[sVar28];
                      uVar26 = 0;
                      *(char *)((long)__s + -8) = -0x3f;
                      *(char *)((long)__s + -7) = 'H';
                      *(char *)((long)__s + -6) = '\x18';
                      *(char *)((long)__s + -5) = '\0';
                      *(char *)((long)__s + -4) = '\0';
                      *(char *)((long)__s + -3) = '\0';
                      *(char *)((long)__s + -2) = '\0';
                      *(char *)((long)__s + -1) = '\0';
                      fprintf(_stderr,
                              "no configuration found for fd:%d passed in by $SERVER_STARTER_PORT\n"
                              ,(ulong)uVar10);
                      sVar21 = conf.server_starter.num_fds;
                    }
                  }
                  if ((int)uVar26 == 0) {
                    builtin_strncpy((char *)((long)__s + -8),"<J\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    fprintf(_stderr,"note: $SERVER_STARTER_PORT was \"%s\"\n",
                            conf.server_starter.env_var);
                    return iVar9;
                  }
                }
                *(char *)((long)__s + -8) = -0x26;
                *(char *)((long)__s + -7) = 'H';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                tVar16 = time((time_t *)0x0);
                *(char *)((long)__s + -8) = -0x1e;
                *(char *)((long)__s + -7) = 'H';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar10 = getpid();
                *(char *)((long)__s + -8) = -0x15;
                *(char *)((long)__s + -7) = 'H';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                srand((uint)tVar16 ^ uVar10);
                aiVar4 = pipefds;
                sVar21 = resolve_tag_arg.node_cache.capacity;
                if (conf.run_mode == RUN_MODE_MASTER) {
LAB_0018490e:
                  builtin_strncpy((char *)((long)__s + -8),"\x1bI\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  run_using_server_starter((char *)sVar21,(char *)aiVar4);
                  return iVar9;
                }
                if (conf.run_mode == RUN_MODE_TEST) {
                  builtin_strncpy((char *)((long)__s + -8),",I\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  puts("configuration OK");
                  return 0;
                }
                if (conf.run_mode == RUN_MODE_DAEMON) {
                  if (conf.error_log != (char *)0x0) goto LAB_0018490e;
                  pcVar18 = 
                  "to run in `daemon` mode, `error-log` must be specified in the configuration file\n"
                  ;
                  *(char *)((long)__s + -8) = 'Q';
                  *(char *)((long)__s + -7) = '\0';
                  *(char *)((long)__s + -6) = '\0';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  goto LAB_00184b3e;
                }
                builtin_strncpy((char *)((long)__s + -8),"@I\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                pcVar18 = getenv("H2O_VIA_MASTER");
                if (pcVar18 != (char *)0x0) {
                  conf.pid_file = (char *)0x0;
                  conf.error_log = (char *)0x0;
                }
                *(char *)((long)__s + -8) = '\a';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                builtin_strncpy((char *)((long)__s + -8),"[I\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar11 = getrlimit((__rlimit_resource_t)*(undefined8 *)((long)__s + -8),
                                   (rlimit *)auStack_68);
                if (iVar11 == 0) {
                  auStack_68._0_4_ = (uint)parse_args.filename;
                  auStack_68._4_4_ = parse_args.filename._4_4_;
                  *(char *)((long)__s + -8) = '\a';
                  *(char *)((long)__s + -7) = '\0';
                  *(char *)((long)__s + -6) = '\0';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  builtin_strncpy((char *)((long)__s + -8),"rI\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar11 = setrlimit((__rlimit_resource_t)*(undefined8 *)((long)__s + -8),
                                     (rlimit *)auStack_68);
                  if (iVar11 == 0) {
                    uVar20 = (ulong)(uint)auStack_68._0_4_;
                    builtin_strncpy((char *)((long)__s + -8),"\vL\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    fprintf(_stderr,"[INFO] raised RLIMIT_NOFILE to %d\n",uVar20);
                  }
                }
                *(char *)((long)__s + -8) = '\x0f';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = -0x77;
                *(char *)((long)__s + -7) = 'I';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler((int)uVar26,on_sigterm);
                *(char *)((long)__s + -8) = '\r';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = '\x01';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                cb = *(_func_void_int **)((long)__s + -8);
                *(char *)((long)__s + -8) = -0x69;
                *(char *)((long)__s + -7) = 'I';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler((int)uVar26,cb);
                *(char *)((long)__s + -8) = -0x5d;
                *(char *)((long)__s + -7) = 'I';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                pcVar18 = h2o_configurator_get_cmd_path(conf.crash_handler);
                resolve_tag_arg.node_cache.entries = (resolve_tag_node_cache_entry_t *)0x0;
                pcStack_88 = pcVar18;
                *(char *)((long)__s + -8) = -0x48;
                *(char *)((long)__s + -7) = 'I';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar12 = pipe((int *)&local_40);
                iVar11 = local_3c;
                if (iVar12 == 0) {
                  *(char *)((long)__s + -8) = '\x02';
                  *(char *)((long)__s + -7) = '\0';
                  *(char *)((long)__s + -6) = '\0';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  uVar26 = *(undefined8 *)((long)__s + -8);
                  *(char *)((long)__s + -8) = '\x01';
                  *(char *)((long)__s + -7) = '\0';
                  *(char *)((long)__s + -6) = '\0';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  uVar2 = *(undefined8 *)((long)__s + -8);
                  *(char *)((long)__s + -8) = -0x30;
                  *(char *)((long)__s + -7) = 'I';
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar11 = fcntl(iVar11,(int)uVar26,uVar2);
                  if (iVar11 == -1) {
                    pcVar18 = "failed to set FD_CLOEXEC on pipefds[1]";
                    goto LAB_00184a69;
                  }
                  auStack_68._0_4_ = local_40;
                  auStack_68._4_4_ = 0;
                  parse_args.filename._0_4_ = 2;
                  parse_args.filename._4_4_ = 1;
                  parse_args.mem_set._0_4_ = 0xffffffff;
                  *(char *)((long)__s + -8) = -5;
                  *(char *)((long)__s + -7) = 'I';
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  pVar13 = h2o_spawnp(pcVar18,&pcStack_88,(int *)auStack_68,0);
                  builtin_strncpy((char *)((long)__s + -8),"\x06J\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  close(local_40);
                  if (pVar13 == -1) {
                    builtin_strncpy((char *)((long)__s + -8),"\x1bJ\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    close(local_3c);
                    goto LAB_00184a6e;
                  }
                  crash_handler_fd = local_3c;
                  if (local_3c == -1) goto LAB_00184a6e;
                }
                else {
                  pcVar18 = "pipe failed";
LAB_00184a69:
                  builtin_strncpy((char *)((long)__s + -8),"nJ\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  perror(pcVar18);
LAB_00184a6e:
                  *(char *)((long)__s + -8) = '\x02';
                  *(char *)((long)__s + -7) = '\0';
                  *(char *)((long)__s + -6) = '\0';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  crash_handler_fd = (int)*(undefined8 *)((long)__s + -8);
                }
                *(char *)((long)__s + -8) = '\x06';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = -0x77;
                *(char *)((long)__s + -7) = 'J';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler((int)uVar26,on_sigfatal);
                *(char *)((long)__s + -8) = '\a';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = -0x6c;
                *(char *)((long)__s + -7) = 'J';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler((int)uVar26,on_sigfatal);
                *(char *)((long)__s + -8) = '\b';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = -0x61;
                *(char *)((long)__s + -7) = 'J';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler((int)uVar26,on_sigfatal);
                *(char *)((long)__s + -8) = '\x04';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = -0x56;
                *(char *)((long)__s + -7) = 'J';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler((int)uVar26,on_sigfatal);
                *(char *)((long)__s + -8) = '\v';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = -0x4b;
                *(char *)((long)__s + -7) = 'J';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                h2o_set_signal_handler((int)uVar26,on_sigfatal);
                if (conf.error_log == (char *)0x0) {
                  *(char *)((long)__s + -8) = -1;
                  *(char *)((long)__s + -7) = -1;
                  *(char *)((long)__s + -6) = -1;
                  *(char *)((long)__s + -5) = -1;
                  *(char *)((long)__s + -4) = -1;
                  *(char *)((long)__s + -3) = -1;
                  *(char *)((long)__s + -2) = -1;
                  *(char *)((long)__s + -1) = -1;
                  iVar11 = (int)*(undefined8 *)((long)__s + -8);
                }
                else {
                  *(char *)((long)__s + -8) = -0x3a;
                  *(char *)((long)__s + -7) = 'J';
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar11 = h2o_access_log_open_log(conf.error_log);
                  if (iVar11 == -1) {
                    return iVar9;
                  }
                }
                *(char *)((long)__s + -8) = '\x01';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                uVar26 = *(undefined8 *)((long)__s + -8);
                *(char *)((long)__s + -8) = '\0';
                *(char *)((long)__s + -7) = 'K';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                setvbuf(_stdout,(char *)0x0,(int)uVar26,0);
                sVar21 = 0;
                builtin_strncpy((char *)((long)__s + -8),"\x16K\x18",4);
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                setvbuf(_stderr,(char *)0x0,(int)uVar26,0);
                if (conf.globalconf.user == (char *)0x0) {
                  builtin_strncpy((char *)((long)__s + -8),"\'K\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  _Var8 = getuid();
                  if (_Var8 == 0) {
                    pcVar18 = 
                    "refusing to run as root (and failed to switch to `nobody`); you can use the `user` directive to set the running user\n"
                    ;
                    *(char *)((long)__s + -8) = 'u';
                    *(char *)((long)__s + -7) = '\0';
                    *(char *)((long)__s + -6) = '\0';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
LAB_00184b3e:
                    sVar3 = *(size_t *)((long)__s + -8);
                    *(char *)((long)__s + -8) = '\x01';
                    *(char *)((long)__s + -7) = '\0';
                    *(char *)((long)__s + -6) = '\0';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    builtin_strncpy((char *)((long)__s + -8),"GK\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    fwrite(pcVar18,sVar3,*(size_t *)((long)__s + -8),_stderr);
                    return iVar9;
                  }
                }
                else {
                  builtin_strncpy((char *)((long)__s + -8),"NK\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar9 = h2o_setuidgid(conf.globalconf.user);
                  if (iVar9 != 0) {
                    pcVar18 = 
                    "failed to change the running user (are you sure you are running as root?)\n";
                    *(char *)((long)__s + -8) = 'J';
                    *(char *)((long)__s + -7) = '\0';
                    *(char *)((long)__s + -6) = '\0';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
LAB_00184be2:
                    sVar3 = *(size_t *)((long)__s + -8);
                    *(char *)((long)__s + -8) = '\x01';
                    *(char *)((long)__s + -7) = '\0';
                    *(char *)((long)__s + -6) = '\0';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    __n = *(size_t *)((long)__s + -8);
                    *(char *)((long)__s + -8) = -0x15;
                    *(char *)((long)__s + -7) = 'K';
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    fwrite(pcVar18,sVar3,__n,_stderr);
                    goto LAB_00184d83;
                  }
                  if (neverbleed != (neverbleed_t *)0x0) {
                    *(char *)((long)__s + -8) = '\x01';
                    *(char *)((long)__s + -7) = '\0';
                    *(char *)((long)__s + -6) = '\0';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    builtin_strncpy((char *)((long)__s + -8),"mK\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    iVar9 = neverbleed_setuidgid
                                      (neverbleed,conf.globalconf.user,
                                       (int)*(undefined8 *)((long)__s + -8));
                    if (iVar9 != 0) {
                      pcVar18 = "failed to change the running user of neverbleed daemon\n";
                      *(char *)((long)__s + -8) = '7';
                      *(char *)((long)__s + -7) = '\0';
                      *(char *)((long)__s + -6) = '\0';
                      *(char *)((long)__s + -5) = '\0';
                      *(char *)((long)__s + -4) = '\0';
                      *(char *)((long)__s + -3) = '\0';
                      *(char *)((long)__s + -2) = '\0';
                      *(char *)((long)__s + -1) = '\0';
                      goto LAB_00184be2;
                    }
                  }
                }
                if (conf.pid_file != (char *)0x0) {
                  *(char *)((long)__s + -8) = -0x6f;
                  *(char *)((long)__s + -7) = 'K';
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  __stream = fopen(conf.pid_file,"wt");
                  pFVar5 = _stderr;
                  pcVar18 = conf.pid_file;
                  if (__stream == (FILE *)0x0) {
                    *(char *)((long)__s + -8) = -0x54;
                    *(char *)((long)__s + -7) = 'K';
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    piVar17 = __errno_location();
                    iVar9 = *piVar17;
                    *(char *)((long)__s + -8) = -0x4d;
                    *(char *)((long)__s + -7) = 'K';
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    pcVar24 = strerror(iVar9);
                    *(char *)((long)__s + -8) = -0x36;
                    *(char *)((long)__s + -7) = 'K';
                    *(char *)((long)__s + -6) = '\x18';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    fprintf(pFVar5,"failed to open pid file:%s:%s\n",pcVar18,pcVar24);
                    goto LAB_00184d83;
                  }
                  builtin_strncpy((char *)((long)__s + -8),"\x18L\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  uVar10 = getpid();
                  builtin_strncpy((char *)((long)__s + -8),"+L\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  fprintf(__stream,"%d\n",(ulong)uVar10);
                  builtin_strncpy((char *)((long)__s + -8),"3L\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  fclose(__stream);
                }
                pipefds[0] = iVar11;
                parse_args.mem_set._0_4_ = 0;
                parse_args.mem_set._4_4_ = 0;
                auStack_68._0_4_ = 0;
                auStack_68._4_4_ = 0;
                parse_args.filename._0_4_ = 0;
                parse_args.filename._4_4_ = 0;
                pcVar18 = (char *)0x0;
                *(char *)((long)__s + -8) = '\b';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                vector = *(h2o_vector_t **)((long)__s + -8);
                for (sVar28 = 0; sVar28 != conf.num_listeners; sVar28 = sVar28 + 1) {
                  for (sVar29 = 0; sVar29 != (conf.listeners[sVar28]->ssl).size; sVar29 = sVar29 + 1
                      ) {
                    builtin_strncpy((char *)((long)__s + -8),"~L\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    h2o_vector__reserve((h2o_mem_pool_t *)auStack_68,vector,(size_t)(pcVar18 + 1),
                                        sVar21);
                    sVar21 = CONCAT44(auStack_68._4_4_,auStack_68._0_4_);
                    pcVar18 = parse_args.filename + 1;
                    *(SSL_CTX **)(sVar21 + (long)parse_args.filename * 8) =
                         (conf.listeners[sVar28]->ssl).entries[sVar29]->ctx;
                    parse_args.filename = pcVar18;
                  }
                }
                contexts = (SSL_CTX **)CONCAT44(auStack_68._4_4_,auStack_68._0_4_);
                *(char *)((long)__s + -8) = -0x3b;
                *(char *)((long)__s + -7) = 'L';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                ssl_setup_session_resumption(contexts,(size_t)pcVar18);
                pvVar1 = (void *)CONCAT44(auStack_68._4_4_,auStack_68._0_4_);
                *(char *)((long)__s + -8) = -0x33;
                *(char *)((long)__s + -7) = 'L';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                free(pvVar1);
                *(char *)((long)__s + -8) = -0x2b;
                *(char *)((long)__s + -7) = 'L';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                iVar9 = pipe((int *)auStack_68);
                uVar6 = auStack_68._4_4_;
                if (iVar9 == 0) {
                  *(char *)((long)__s + -8) = -0x1f;
                  *(char *)((long)__s + -7) = 'L';
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  close(uVar6);
                  uVar6 = auStack_68._0_4_;
                  *(char *)((long)__s + -8) = -0x15;
                  *(char *)((long)__s + -7) = 'L';
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  dup2(uVar6,0);
                  uVar6 = auStack_68._0_4_;
                  *(char *)((long)__s + -8) = -0xd;
                  *(char *)((long)__s + -7) = 'L';
                  *(char *)((long)__s + -6) = '\x18';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  close(uVar6);
                  iVar9 = pipefds[0];
                  if (pipefds[0] == -1) {
LAB_00184cfd:
                    pFVar5 = _stderr;
                    builtin_strncpy((char *)((long)__s + -8),"\fM\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    uVar10 = getpid();
                    builtin_strncpy((char *)((long)__s + -8),"\x1fM\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    fprintf(pFVar5,"h2o server (pid:%d) is ready to serve requests\n",(ulong)uVar10)
                    ;
                    if (conf.num_threads == 0) {
                      builtin_strncpy((char *)((long)__s + -8),"JM\x18",4);
                      *(char *)((long)__s + -4) = '\0';
                      *(char *)((long)__s + -3) = '\0';
                      *(char *)((long)__s + -2) = '\0';
                      *(char *)((long)__s + -1) = '\0';
                      __assert_fail("conf.num_threads != 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                                    ,0x8af,"int main(int, char **)");
                    }
                    paVar19 = (anon_struct_968_4_e2476a95 *)
                              ((long)__s + -(conf.num_threads * 0x3c8 + 0xf & 0xfffffffffffffff0));
                    paVar19[-1].memcached.cb = (h2o_multithread_receiver_cb)0x184dcf;
                    conf.threads = paVar19;
                    h2o_barrier_init(&conf.startup_sync_barrier,conf.num_threads);
                    for (; cb != (_func_void_int *)conf.num_threads; cb = cb + 1) {
                      paVar19[-1].memcached.cb = (h2o_multithread_receiver_cb)0x184df3;
                      h2o_multithread_create_thread
                                ((pthread_t *)auStack_68,(pthread_attr_t *)0x0,run_loop,cb);
                    }
                    paVar19[-1].memcached.cb = (h2o_multithread_receiver_cb)0x184dff;
                    run_loop((void *)0x0);
                  }
                  *(char *)((long)__s + -8) = '\x01';
                  *(char *)((long)__s + -7) = '\0';
                  *(char *)((long)__s + -6) = '\0';
                  *(char *)((long)__s + -5) = '\0';
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  builtin_strncpy((char *)((long)__s + -8),"^M\x18",4);
                  *(char *)((long)__s + -4) = '\0';
                  *(char *)((long)__s + -3) = '\0';
                  *(char *)((long)__s + -2) = '\0';
                  *(char *)((long)__s + -1) = '\0';
                  iVar11 = dup2(iVar9,(int)*(undefined8 *)((long)__s + -8));
                  if (iVar11 != -1) {
                    *(char *)((long)__s + -8) = '\x02';
                    *(char *)((long)__s + -7) = '\0';
                    *(char *)((long)__s + -6) = '\0';
                    *(char *)((long)__s + -5) = '\0';
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    builtin_strncpy((char *)((long)__s + -8),"nM\x18",4);
                    *(char *)((long)__s + -4) = '\0';
                    *(char *)((long)__s + -3) = '\0';
                    *(char *)((long)__s + -2) = '\0';
                    *(char *)((long)__s + -1) = '\0';
                    iVar11 = dup2(iVar9,(int)*(undefined8 *)((long)__s + -8));
                    if (iVar11 != -1) {
                      builtin_strncpy((char *)((long)__s + -8),"\aN\x18",4);
                      *(char *)((long)__s + -4) = '\0';
                      *(char *)((long)__s + -3) = '\0';
                      *(char *)((long)__s + -2) = '\0';
                      *(char *)((long)__s + -1) = '\0';
                      close(iVar9);
                      goto LAB_00184cfd;
                    }
                  }
                  pcVar18 = "dup(2) failed";
                }
                else {
                  pcVar18 = "pipe failed";
                }
                *(char *)((long)__s + -8) = -0x7d;
                *(char *)((long)__s + -7) = 'M';
                *(char *)((long)__s + -6) = '\x18';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                perror(pcVar18);
LAB_00184d83:
                *(char *)((long)__s + -8) = 'G';
                *(char *)((long)__s + -7) = '\0';
                *(char *)((long)__s + -6) = '\0';
                *(char *)((long)__s + -5) = '\0';
                *(char *)((long)__s + -4) = '\0';
                *(char *)((long)__s + -3) = '\0';
                *(char *)((long)__s + -2) = '\0';
                *(char *)((long)__s + -1) = '\0';
                return (int)*(undefined8 *)((long)__s + -8);
              }
            }
          }
LAB_00184e3f:
          puVar23 = (undefined8 *)((long)ppcVar22 + -8);
          *(undefined8 *)((long)ppcVar22 + -8) = 0x4e;
          goto LAB_00184e41;
        }
        if (iVar9 != 99) {
          ppcVar22 = &pcStack_88;
          if ((iVar9 != 0x3a) && (ppcVar22 = &pcStack_88, iVar9 != 0x3f)) {
            if (iVar9 == 0x68) {
              pcVar24 = 
              "h2o version 2.2.5\n\nUsage:\n  h2o [options]\n\nOptions:\n  -c, --conf FILE    configuration file (default: %s)\n  -m, --mode <mode>  specifies one of the following mode\n                     - worker: invoked process handles incoming connections\n                               (default)\n                     - daemon: spawns a master process and exits. `error-log`\n                               must be configured when using this mode, as all\n                               the errors are logged to the file instead of\n                               being emitted to STDERR\n                     - master: invoked process becomes a master process (using\n                               the `share/h2o/start_server` command) and spawns\n                               a worker process for handling incoming\n                               connections. Users may send SIGHUP to the master\n                               process to reconfigure or upgrade the server.\n                     - test:   tests the configuration and exits\n  -t, --test         synonym of `--mode=test`\n  -v, --version      prints the version number\n  -h, --help         print this help\n\nPlease refer to the documentation under `share/doc/h2o` (or available online at\nhttp://h2o.examp1e.net/) for how to configure the server.\n\n"
              ;
              pcVar18 = "etc/h2o.conf";
            }
            else {
              if (iVar9 != 0x76) {
                uStack_90 = 0x184e82;
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/src/main.c"
                              ,0x802,"int main(int, char **)");
              }
              uStack_90 = 0x184e2c;
              puts("h2o version 2.2.5");
              uStack_90 = 0x184e33;
              pcVar18 = (char *)OpenSSL_version(0);
              pcVar24 = "OpenSSL: %s\n";
            }
            uStack_90 = 0x184e5c;
            printf(pcVar24,pcVar18);
            uStack_90 = 0x184e63;
            exit(0);
          }
          goto LAB_00184e3f;
        }
        pipefds[0] = _optarg;
        pipefds[1] = optarg_4;
      }
    }
    uStack_90 = 0x184662;
    iVar9 = strcmp((char *)_optarg,"worker");
    if (iVar9 == 0) {
      conf.run_mode = RUN_MODE_WORKER;
      goto LAB_0018461b;
    }
    uStack_90 = 0x184679;
    iVar9 = strcmp((char *)aiVar4,"master");
    rVar7 = RUN_MODE_MASTER;
    if (iVar9 != 0) {
      uStack_90 = 0x18468f;
      iVar9 = strcmp((char *)aiVar4,"daemon");
      rVar7 = RUN_MODE_DAEMON;
      if (iVar9 != 0) {
        uStack_90 = 0x1846a5;
        iVar9 = strcmp((char *)aiVar4,"test");
        if (iVar9 == 0) goto LAB_0018463d;
        uStack_90 = 0x1846c4;
        fprintf(_stderr,"unknown mode:%s\n",aiVar4);
        rVar7 = conf.run_mode;
        if (1 < conf.run_mode - RUN_MODE_MASTER) goto LAB_0018461b;
      }
    }
    conf.run_mode = rVar7;
    uStack_90 = 0x1846e9;
    pcVar18 = getenv("SERVER_STARTER_PORT");
    if (pcVar18 != (char *)0x0) {
      uStack_90 = 0x184ea4;
      fprintf(_stderr,
              "refusing to start in `%s` mode, environment variable SERVER_STARTER_PORT is already set\n"
              ,_optarg);
      puVar23 = &uStack_90;
      uStack_90 = 0x46;
LAB_00184e41:
      uVar26 = *puVar23;
      *puVar23 = 0x184e47;
      exit((int)uVar26);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    const char *cmd = argv[0], *opt_config_file = H2O_TO_STR(H2O_CONFIG_PATH);
    int error_log_fd = -1;

    conf.num_threads = h2o_numproc();
    conf.tfo_queues = H2O_DEFAULT_LENGTH_TCP_FASTOPEN_QUEUE;
    conf.launch_time = time(NULL);

    h2o_hostinfo_max_threads = H2O_DEFAULT_NUM_NAME_RESOLUTION_THREADS;

    h2o_sem_init(&ocsp_updater_semaphore, H2O_DEFAULT_OCSP_UPDATER_MAX_THREADS);

    init_openssl();
    setup_configurators();

    { /* parse options */
        int ch;
        static struct option longopts[] = {{"conf", required_argument, NULL, 'c'}, {"mode", required_argument, NULL, 'm'},
                                           {"test", no_argument, NULL, 't'},       {"version", no_argument, NULL, 'v'},
                                           {"help", no_argument, NULL, 'h'},       {NULL}};
        while ((ch = getopt_long(argc, argv, "c:m:tvh", longopts, NULL)) != -1) {
            switch (ch) {
            case 'c':
                opt_config_file = optarg;
                break;
            case 'm':
                if (strcmp(optarg, "worker") == 0) {
                    conf.run_mode = RUN_MODE_WORKER;
                } else if (strcmp(optarg, "master") == 0) {
                    conf.run_mode = RUN_MODE_MASTER;
                } else if (strcmp(optarg, "daemon") == 0) {
                    conf.run_mode = RUN_MODE_DAEMON;
                } else if (strcmp(optarg, "test") == 0) {
                    conf.run_mode = RUN_MODE_TEST;
                } else {
                    fprintf(stderr, "unknown mode:%s\n", optarg);
                }
                switch (conf.run_mode) {
                case RUN_MODE_MASTER:
                case RUN_MODE_DAEMON:
                    if (getenv("SERVER_STARTER_PORT") != NULL) {
                        fprintf(stderr, "refusing to start in `%s` mode, environment variable SERVER_STARTER_PORT is already set\n",
                                optarg);
                        exit(EX_SOFTWARE);
                    }
                    break;
                default:
                    break;
                }
                break;
            case 't':
                conf.run_mode = RUN_MODE_TEST;
                break;
            case 'v':
                printf("h2o version " H2O_VERSION "\n");
                printf("OpenSSL: %s\n", SSLeay_version(SSLEAY_VERSION));
#if H2O_USE_MRUBY
                printf(
                    "mruby: YES\n"); /* TODO determine the way to obtain the version of mruby (that is being linked dynamically) */
#endif
                exit(0);
            case 'h':
                printf("h2o version " H2O_VERSION "\n"
                       "\n"
                       "Usage:\n"
                       "  h2o [options]\n"
                       "\n"
                       "Options:\n"
                       "  -c, --conf FILE    configuration file (default: %s)\n"
                       "  -m, --mode <mode>  specifies one of the following mode\n"
                       "                     - worker: invoked process handles incoming connections\n"
                       "                               (default)\n"
                       "                     - daemon: spawns a master process and exits. `error-log`\n"
                       "                               must be configured when using this mode, as all\n"
                       "                               the errors are logged to the file instead of\n"
                       "                               being emitted to STDERR\n"
                       "                     - master: invoked process becomes a master process (using\n"
                       "                               the `share/h2o/start_server` command) and spawns\n"
                       "                               a worker process for handling incoming\n"
                       "                               connections. Users may send SIGHUP to the master\n"
                       "                               process to reconfigure or upgrade the server.\n"
                       "                     - test:   tests the configuration and exits\n"
                       "  -t, --test         synonym of `--mode=test`\n"
                       "  -v, --version      prints the version number\n"
                       "  -h, --help         print this help\n"
                       "\n"
                       "Please refer to the documentation under `share/doc/h2o` (or available online at\n"
                       "http://h2o.examp1e.net/) for how to configure the server.\n"
                       "\n",
                       H2O_TO_STR(H2O_CONFIG_PATH));
                exit(0);
                break;
            case ':':
            case '?':
                exit(EX_CONFIG);
            default:
                assert(0);
                break;
            }
        }
        argc -= optind;
        argv += optind;
    }

    /* setup conf.server_starter */
    if ((conf.server_starter.num_fds = h2o_server_starter_get_fds(&conf.server_starter.fds)) == SIZE_MAX)
        exit(EX_CONFIG);
    if (conf.server_starter.fds != 0) {
        size_t i;
        for (i = 0; i != conf.server_starter.num_fds; ++i)
            set_cloexec(conf.server_starter.fds[i]);
        conf.server_starter.bound_fd_map = alloca(conf.server_starter.num_fds);
        memset(conf.server_starter.bound_fd_map, 0, conf.server_starter.num_fds);
        conf.server_starter.env_var = getenv("SERVER_STARTER_PORT");
    }
    unsetenv("SERVER_STARTER_PORT");

    { /* configure */
        yoml_t *yoml;
        resolve_tag_arg_t resolve_tag_arg = {{NULL}};
        yoml_parse_args_t parse_args = {
            opt_config_file,                /* filename */
            NULL,                           /* mem_set */
            {resolve_tag, &resolve_tag_arg} /* resolve_tag */
        };
        if ((yoml = load_config(&parse_args, NULL)) == NULL)
            exit(EX_CONFIG);
        if (h2o_configurator_apply(&conf.globalconf, yoml, conf.run_mode != RUN_MODE_WORKER) != 0)
            exit(EX_CONFIG);

        dispose_resolve_tag_arg(&resolve_tag_arg);
        yoml_free(yoml, NULL);
    }
    /* calculate defaults (note: open file cached is purged once every loop) */
    conf.globalconf.filecache.capacity = conf.globalconf.http2.max_concurrent_requests_per_connection * 2;

    /* check if all the fds passed in by server::starter were bound */
    if (conf.server_starter.fds != NULL) {
        size_t i;
        int all_were_bound = 1;
        for (i = 0; i != conf.server_starter.num_fds; ++i) {
            if (!conf.server_starter.bound_fd_map[i]) {
                fprintf(stderr, "no configuration found for fd:%d passed in by $SERVER_STARTER_PORT\n", conf.server_starter.fds[i]);
                all_were_bound = 0;
            }
        }
        if (!all_were_bound) {
            fprintf(stderr, "note: $SERVER_STARTER_PORT was \"%s\"\n", conf.server_starter.env_var);
            return EX_CONFIG;
        }
    }

    h2o_srand();
    /* handle run_mode == MASTER|TEST */
    switch (conf.run_mode) {
    case RUN_MODE_WORKER:
        break;
    case RUN_MODE_DAEMON:
        if (conf.error_log == NULL) {
            fprintf(stderr, "to run in `daemon` mode, `error-log` must be specified in the configuration file\n");
            return EX_CONFIG;
        }
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_MASTER:
        return run_using_server_starter(cmd, opt_config_file);
    case RUN_MODE_TEST:
        printf("configuration OK\n");
        return 0;
    }

    if (getenv("H2O_VIA_MASTER") != NULL) {
        /* pid_file and error_log are the directives that are handled by the master process (invoking start_server) */
        conf.pid_file = NULL;
        conf.error_log = NULL;
    }

    { /* raise RLIMIT_NOFILE */
        struct rlimit limit;
        if (getrlimit(RLIMIT_NOFILE, &limit) == 0) {
            limit.rlim_cur = limit.rlim_max;
            if (setrlimit(RLIMIT_NOFILE, &limit) == 0
#ifdef __APPLE__
                || (limit.rlim_cur = OPEN_MAX, setrlimit(RLIMIT_NOFILE, &limit)) == 0
#endif
                ) {
                fprintf(stderr, "[INFO] raised RLIMIT_NOFILE to %d\n", (int)limit.rlim_cur);
            }
        }
    }

    setup_signal_handlers();

    /* open the log file to redirect STDIN/STDERR to, before calling setuid */
    if (conf.error_log != NULL) {
        if ((error_log_fd = h2o_access_log_open_log(conf.error_log)) == -1)
            return EX_CONFIG;
    }
    setvbuf(stdout, NULL, _IOLBF, 0);
    setvbuf(stderr, NULL, _IOLBF, 0);

    /* setuid */
    if (conf.globalconf.user != NULL) {
        if (h2o_setuidgid(conf.globalconf.user) != 0) {
            fprintf(stderr, "failed to change the running user (are you sure you are running as root?)\n");
            return EX_OSERR;
        }
        if (neverbleed != NULL && neverbleed_setuidgid(neverbleed, conf.globalconf.user, 1) != 0) {
            fprintf(stderr, "failed to change the running user of neverbleed daemon\n");
            return EX_OSERR;
        }
    } else {
        if (getuid() == 0) {
            fprintf(stderr, "refusing to run as root (and failed to switch to `nobody`); you can use the `user` directive to set "
                            "the running user\n");
            return EX_CONFIG;
        }
    }

    /* pid file must be written after setuid, since we need to remove it  */
    if (conf.pid_file != NULL) {
        FILE *fp = fopen(conf.pid_file, "wt");
        if (fp == NULL) {
            fprintf(stderr, "failed to open pid file:%s:%s\n", conf.pid_file, strerror(errno));
            return EX_OSERR;
        }
        fprintf(fp, "%d\n", (int)getpid());
        fclose(fp);
    }

    { /* initialize SSL_CTXs for session resumption and ticket-based resumption (also starts memcached client threads for the
         purpose) */
        size_t i, j;
        H2O_VECTOR(SSL_CTX *) ssl_contexts = {NULL};
        for (i = 0; i != conf.num_listeners; ++i) {
            for (j = 0; j != conf.listeners[i]->ssl.size; ++j) {
                h2o_vector_reserve(NULL, &ssl_contexts, ssl_contexts.size + 1);
                ssl_contexts.entries[ssl_contexts.size++] = conf.listeners[i]->ssl.entries[j]->ctx;
            }
        }
        ssl_setup_session_resumption(ssl_contexts.entries, ssl_contexts.size);
        free(ssl_contexts.entries);
    }

    /* all setup should be complete by now */

    /* replace STDIN to an closed pipe */
    {
        int fds[2];
        if (pipe(fds) != 0) {
            perror("pipe failed");
            return EX_OSERR;
        }
        close(fds[1]);
        dup2(fds[0], 0);
        close(fds[0]);
    }

    /* redirect STDOUT and STDERR to error_log (if specified) */
    if (error_log_fd != -1) {
        if (dup2(error_log_fd, 1) == -1 || dup2(error_log_fd, 2) == -1) {
            perror("dup(2) failed");
            return EX_OSERR;
        }
        close(error_log_fd);
        error_log_fd = -1;
    }

    fprintf(stderr, "h2o server (pid:%d) is ready to serve requests\n", (int)getpid());

    assert(conf.num_threads != 0);

    /* start the threads */
    conf.threads = alloca(sizeof(conf.threads[0]) * conf.num_threads);
    h2o_barrier_init(&conf.startup_sync_barrier, conf.num_threads);
    size_t i;
    for (i = 1; i != conf.num_threads; ++i) {
        pthread_t tid;
        h2o_multithread_create_thread(&tid, NULL, run_loop, (void *)i);
    }

    /* this thread becomes the first thread */
    run_loop((void *)0);

    /* notreached */
    return 0;
}